

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cpp
# Opt level: O0

void __thiscall CaDiCaL::Proof::delete_clause(Proof *this,Clause *c)

{
  undefined8 *in_RSI;
  long in_RDI;
  
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0xe0dde6);
  add_literals(this,c);
  *(undefined8 *)(in_RDI + 0x38) = *in_RSI;
  *(byte *)(in_RDI + 0x40) = (byte)(*(uint *)(in_RSI + 1) >> 0xb) & 1;
  delete_clause(this);
  return;
}

Assistant:

void Proof::delete_clause (Clause *c) {
  LOG (c, "PROOF deleting from proof");
  clause.clear (); // Can be non-empty if an allocation fails during adding.
  add_literals (c);
  clause_id = c->id;
  redundant = c->redundant;
  delete_clause (); // Increments 'statistics.deleted'.
}